

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmClientContext.cpp
# Opt level: O0

GMM_SURFACESTATE_FORMAT __thiscall
GmmLib::GmmClientContext::GetSurfaceStateFormat(GmmClientContext *this,GMM_RESOURCE_FORMAT Format)

{
  GMM_PLATFORM_INFO *pGVar1;
  GMM_SURFACESTATE_FORMAT local_24;
  GMM_RESOURCE_FORMAT Format_local;
  GmmClientContext *this_local;
  
  if (((int)Format < 1) || (0x180 < (int)Format)) {
    local_24 = GMM_SURFACESTATE_FORMAT_INVALID;
  }
  else {
    pGVar1 = Context::GetPlatformInfo(this->pGmmLibContext);
    local_24 = pGVar1->FormatTable[Format].SurfaceStateFormat;
  }
  return local_24;
}

Assistant:

GMM_SURFACESTATE_FORMAT GMM_STDCALL GmmLib::GmmClientContext::GetSurfaceStateFormat(GMM_RESOURCE_FORMAT Format)
{
    // ToDo: Remove the definition of GmmGetSurfaceStateFormat(Format)
    return ((Format > GMM_FORMAT_INVALID) &&
            (Format < GMM_RESOURCE_FORMATS)) ?
           pGmmLibContext->GetPlatformInfo().FormatTable[Format].SurfaceStateFormat :
           GMM_SURFACESTATE_FORMAT_INVALID;
}